

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_mac.c
# Opt level: O0

bool_t beltMACStepV(octet *mac,void *state)

{
  bool_t bVar1;
  void *in_RSI;
  void *in_RDI;
  belt_mac_st *st;
  
  beltMACStepG_internal(in_RSI);
  bVar1 = memEq(in_RDI,(void *)((long)in_RSI + 0x40),8);
  return bVar1;
}

Assistant:

bool_t beltMACStepV(const octet mac[8], void* state)
{
	belt_mac_st* st = (belt_mac_st*)state;
	ASSERT(memIsValid(mac, 8));
	beltMACStepG_internal(state);
#if (OCTET_ORDER == BIG_ENDIAN)
	st->mac[0] = u32Rev(st->mac[0]);
	st->mac[1] = u32Rev(st->mac[1]);
#endif
	return memEq(mac, st->mac, 8);
}